

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O3

vector<duckdb::Value,_true> *
duckdb::TestVectorFlat::GenerateValues
          (vector<duckdb::Value,_true> *__return_storage_ptr__,TestVectorInfo *info,
          LogicalType *type)

{
  LogicalTypeId LVar1;
  pointer pcVar2;
  element_type *peVar3;
  child_list_t<LogicalType> *pcVar4;
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  *this;
  reference pvVar5;
  LogicalType *pLVar6;
  _Rb_tree_header *p_Var7;
  NotImplementedException *this_00;
  _Base_ptr p_Var8;
  size_type __n;
  _Base_ptr p_Var9;
  long lVar10;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *this_01;
  pointer ppVar11;
  element_type *peVar12;
  bool bVar13;
  initializer_list<duckdb::Value> __l;
  initializer_list<duckdb::Value> __l_00;
  initializer_list<duckdb::Value> __l_01;
  initializer_list<duckdb::Value> __l_02;
  vector<duckdb::Value,_true> child_values;
  vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_true>
  struct_children;
  allocator_type local_1f1;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *local_1f0;
  vector<duckdb::Value,_true> local_1e8;
  TestVectorInfo *local_1d0;
  Value local_1c8;
  undefined1 local_180 [128];
  pointer local_100;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_f8;
  vector<duckdb::Value,_true> local_e0;
  vector<duckdb::Value,_true> local_c8;
  vector<duckdb::Value,_true> local_b0;
  LogicalType local_98;
  vector<duckdb::Value,_true> local_80;
  vector<duckdb::Value,_true> local_68;
  string local_50;
  
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f0 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)__return_storage_ptr__;
  local_1d0 = info;
  if (type->physical_type_ == LIST) {
    if (type->id_ == MAP) {
      pLVar6 = ListType::GetChildType(type);
      GenerateValues(&local_1e8,local_1d0,pLVar6);
      pvVar5 = vector<duckdb::Value,_true>::operator[](&local_1e8,0);
      Value::Value(&local_1c8,pvVar5);
      __l._M_len = 1;
      __l._M_array = &local_1c8;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_80,__l,&local_1f1);
      Value::MAP((Value *)local_180,pLVar6,&local_80);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (local_1f0,(Value *)local_180);
      Value::~Value((Value *)local_180);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_80);
      Value::~Value(&local_1c8);
      LogicalType::LogicalType(&local_98,type);
      Value::Value((Value *)local_180,&local_98);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (local_1f0,(Value *)local_180);
      Value::~Value((Value *)local_180);
      LogicalType::~LogicalType(&local_98);
      pvVar5 = vector<duckdb::Value,_true>::operator[](&local_1e8,1);
      Value::Value(&local_1c8,pvVar5);
      __l_00._M_len = 1;
      __l_00._M_array = &local_1c8;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b0,__l_00,
                 &local_1f1);
      Value::MAP((Value *)local_180,pLVar6,&local_b0);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (local_1f0,(Value *)local_180);
      Value::~Value((Value *)local_180);
      this_01 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b0;
    }
    else {
      pLVar6 = ListType::GetChildType(type);
      GenerateValues(&local_1e8,local_1d0,pLVar6);
      pvVar5 = vector<duckdb::Value,_true>::operator[](&local_1e8,0);
      Value::Value((Value *)local_180,pvVar5);
      pvVar5 = vector<duckdb::Value,_true>::operator[](&local_1e8,1);
      Value::Value((Value *)(local_180 + 0x40),pvVar5);
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)local_180;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c8,__l_01,
                 &local_1f1);
      Value::LIST(&local_1c8,pLVar6,&local_c8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (local_1f0,&local_1c8);
      Value::~Value(&local_1c8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c8);
      lVar10 = 0x40;
      do {
        Value::~Value((Value *)(local_180 + lVar10));
        lVar10 = lVar10 + -0x40;
      } while (lVar10 != -0x40);
      local_68.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::LIST((Value *)local_180,pLVar6,&local_68);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (local_1f0,(Value *)local_180);
      Value::~Value((Value *)local_180);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_68);
      pvVar5 = vector<duckdb::Value,_true>::operator[](&local_1e8,2);
      Value::Value(&local_1c8,pvVar5);
      __l_02._M_len = 1;
      __l_02._M_array = &local_1c8;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e0,__l_02,
                 &local_1f1);
      Value::LIST((Value *)local_180,pLVar6,&local_e0);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (local_1f0,(Value *)local_180);
      Value::~Value((Value *)local_180);
      this_01 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e0;
    }
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(this_01);
    Value::~Value(&local_1c8);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1e8);
  }
  else {
    if (type->physical_type_ != STRUCT) {
      p_Var8 = (info->test_type_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var8 != (_Base_ptr)0x0) {
        LVar1 = type->id_;
        p_Var7 = &(info->test_type_map->_M_t)._M_impl.super__Rb_tree_header;
        p_Var9 = &p_Var7->_M_header;
        do {
          bVar13 = (LogicalTypeId)p_Var8[1]._M_color < LVar1;
          if (!bVar13) {
            p_Var9 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[bVar13];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var9 != p_Var7) && ((LogicalTypeId)p_Var9[1]._M_color <= LVar1)) {
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)__return_storage_ptr__
                     ,(value_type *)(p_Var9 + 3));
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)__return_storage_ptr__
                     ,(value_type *)(p_Var9 + 5));
          ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
          emplace_back<duckdb::LogicalType_const&>
                    ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)__return_storage_ptr__,
                     type);
          return __return_storage_ptr__;
        }
      }
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"Unimplemented type for test_vector_types %s","");
      LogicalType::ToString_abi_cxx11_(&local_50,type);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this_00,(string *)local_180,&local_50);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_1c8.type_._0_8_ = (element_type *)0x0;
    local_1c8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1c8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pcVar4 = StructType::GetChildTypes_abi_cxx11_(type);
    ::std::
    vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
    ::resize((vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
              *)&local_1c8,3);
    ppVar11 = (pcVar4->
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_100 = (pcVar4->
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar11 != local_100) {
      do {
        GenerateValues(&local_1e8,local_1d0,&ppVar11->second);
        if (local_1e8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_1e8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start) {
          __n = 0;
          do {
            this = (vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                    *)vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_true>
                      ::operator[]((vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_true>
                                    *)&local_1c8,__n);
            pvVar5 = vector<duckdb::Value,_true>::operator[](&local_1e8,__n);
            local_180._0_8_ = local_180 + 0x10;
            pcVar2 = (ppVar11->first)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_180,pcVar2,pcVar2 + (ppVar11->first)._M_string_length);
            Value::Value((Value *)(local_180 + 0x20),pvVar5);
            ::std::
            vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
            ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
                      (this,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                             *)local_180);
            Value::~Value((Value *)(local_180 + 0x20));
            if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
              operator_delete((void *)local_180._0_8_);
            }
            __n = __n + 1;
          } while (__n < (ulong)((long)local_1e8.
                                       super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_1e8.
                                       super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 6));
        }
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1e8);
        ppVar11 = ppVar11 + 1;
      } while (ppVar11 != local_100);
    }
    peVar3 = local_1c8.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((element_type *)local_1c8.type_._0_8_ !=
        local_1c8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      peVar12 = (element_type *)local_1c8.type_._0_8_;
      do {
        local_f8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)
              &((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 *)&peVar12->_vptr_ExtraTypeInfo)->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ;
        local_f8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&peVar12->type;
        local_f8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(peVar12->alias)._M_dataplus._M_p;
        *(undefined8 *)
         &((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
            *)&peVar12->_vptr_ExtraTypeInfo)->
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
             = 0;
        *(pointer *)&peVar12->type = (pointer)0x0;
        (peVar12->alias)._M_dataplus._M_p = (pointer)0x0;
        Value::STRUCT((Value *)local_180,(child_list_t<Value> *)&local_f8);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  (local_1f0,(Value *)local_180);
        Value::~Value((Value *)local_180);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ::~vector(&local_f8);
        peVar12 = (element_type *)&(peVar12->alias)._M_string_length;
      } while (peVar12 != peVar3);
    }
    ::std::
    vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
    ::~vector((vector<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>,_std::allocator<duckdb::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
               *)&local_1c8);
  }
  return (vector<duckdb::Value,_true> *)local_1f0;
}

Assistant:

static vector<Value> GenerateValues(TestVectorInfo &info, const LogicalType &type) {
		vector<Value> result;
		switch (type.InternalType()) {
		case PhysicalType::STRUCT: {
			vector<child_list_t<Value>> struct_children;
			auto &child_types = StructType::GetChildTypes(type);

			struct_children.resize(TEST_VECTOR_CARDINALITY);
			for (auto &child_type : child_types) {
				auto child_values = GenerateValues(info, child_type.second);

				for (idx_t i = 0; i < child_values.size(); i++) {
					struct_children[i].push_back(make_pair(child_type.first, std::move(child_values[i])));
				}
			}
			for (auto &struct_child : struct_children) {
				result.push_back(Value::STRUCT(std::move(struct_child)));
			}
			break;
		}
		case PhysicalType::LIST: {
			if (type.id() == LogicalTypeId::MAP) {
				auto &child_type = ListType::GetChildType(type);
				auto child_values = GenerateValues(info, child_type);
				result.push_back(Value::MAP(child_type, {child_values[0]}));
				result.push_back(Value(type));
				result.push_back(Value::MAP(child_type, {child_values[1]}));
				break;
			}
			auto &child_type = ListType::GetChildType(type);
			auto child_values = GenerateValues(info, child_type);

			result.push_back(Value::LIST(child_type, {child_values[0], child_values[1]}));
			result.push_back(Value::LIST(child_type, {}));
			result.push_back(Value::LIST(child_type, {child_values[2]}));
			break;
		}
		default: {
			auto entry = info.test_type_map.find(type.id());
			if (entry == info.test_type_map.end()) {
				throw NotImplementedException("Unimplemented type for test_vector_types %s", type.ToString());
			}
			result.push_back(entry->second.min_value);
			result.push_back(entry->second.max_value);
			result.emplace_back(type);
			break;
		}
		}
		return result;
	}